

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::eval_test::test(eval_test *this)

{
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  string local_38 [32];
  ulong local_18;
  uint64_t res;
  eval_test *this_local;
  
  res = (uint64_t)this;
  compile_fixture_skiwi::build_eval((compile_fixture_skiwi *)this);
  std::allocator<char>::allocator();
  pcVar2 = "(eval \'(+ 3 4))";
  std::__cxx11::string::string<std::allocator<char>>(local_38,"(eval \'(+ 3 4))",&local_39);
  uVar1 = skiwi::skiwi_run_raw((skiwi *)local_38,(string *)pcVar2);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = uVar1;
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_70,uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14d3,"void skiwi::(anonymous namespace)::eval_test::test()");
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::allocator();
  pcVar2 = "(define (eval-formula formula) (eval `(let([x 2] [y 3]) ,formula)))";
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"(define (eval-formula formula) (eval `(let([x 2] [y 3]) ,formula)))",
             &local_91);
  local_18 = skiwi::skiwi_run_raw((skiwi *)local_90,(string *)pcVar2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_b8,local_18,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14d5,"void skiwi::(anonymous namespace)::eval_test::test()");
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::allocator();
  pcVar2 = "(eval-formula \'(+ x y))";
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"(eval-formula \'(+ x y))",&local_d9);
  local_18 = skiwi::skiwi_run_raw((skiwi *)local_d8,(string *)pcVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_100,local_18,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14d7,"void skiwi::(anonymous namespace)::eval_test::test()");
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::allocator();
  pcVar2 = "(eval-formula \'(+ (* x y) y))";
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"(eval-formula \'(+ (* x y) y))",&local_121);
  local_18 = skiwi::skiwi_run_raw((skiwi *)local_120,(string *)pcVar2);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_148,local_18,6);
  TestEq<char_const*,std::__cxx11::string>
            ("9",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14d9,"void skiwi::(anonymous namespace)::eval_test::test()");
  std::__cxx11::string::~string((string *)&local_148);
  return;
}

Assistant:

void test()
      {
      using namespace skiwi;
      build_eval();
      uint64_t res = skiwi_run_raw("(eval '(+ 3 4))");
      TEST_EQ("7", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(define (eval-formula formula) (eval `(let([x 2] [y 3]) ,formula)))");
      TEST_EQ("<lambda>", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(eval-formula '(+ x y))");
      TEST_EQ("5", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(eval-formula '(+ (* x y) y))");
      TEST_EQ("9", skiwi_raw_to_string(res));
      }